

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O1

int fe_start_utt(fe_t *fe)

{
  fe->num_overflow_samps = 0;
  memset(fe->overflow_samps,0,(long)fe->frame_size * 2);
  fe->pre_emphasis_prior = 0;
  return 0;
}

Assistant:

int32
fe_start_utt(fe_t * fe)
{
    fe->num_overflow_samps = 0;
    // Does the same thing as above, but whatever...
    memset(fe->overflow_samps, 0,
           fe->frame_size * sizeof(*fe->overflow_samps));
    fe->pre_emphasis_prior = 0;
    return 0;
}